

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
delta_complex_t::if_common_create
          (delta_complex_t *this,index_t cl,index_t v,index_t dim,char *filter,size_t thread,
          vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
          *new_cells,
          vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
          *new_cliques,
          vector<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
          *new_clique_cofaces,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  pointer ppVar7;
  ulong uVar8;
  size_type sVar9;
  reference this_00;
  reference pvVar10;
  char *pcVar11;
  reference plVar12;
  reference __x;
  double dVar13;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_350;
  vector<long,_std::allocator<long>_> local_338;
  delta_complex_cell_t local_320;
  size_type local_238;
  index_t loc;
  vector<long,_std::allocator<long>_> t;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range3;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  new_orients;
  long f;
  iterator __end2;
  iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  value_type_conflict4 local_1c0 [2];
  int local_1b0;
  int local_1ac;
  int j_1;
  int count;
  string bin;
  vector<long,_std::allocator<long>_> top_row;
  int local_168;
  int i_1;
  int k;
  int num_bidirect;
  vector<long,_std::allocator<long>_> local_148;
  clique_t local_130;
  size_type local_c0;
  index_t cli_loc;
  long j;
  iterator __end1;
  iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  vector<long,_std::allocator<long>_> new_vertices;
  _Node_iterator_base<std::pair<const_long,_int>,_false> local_78;
  _Node_iterator_base<std::pair<const_long,_int>,_false> local_70;
  iterator it;
  int i;
  _Node_iterator_base<std::pair<const_long,_int>,_false> local_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> orient;
  size_t thread_local;
  char *filter_local;
  index_t dim_local;
  index_t v_local;
  index_t cl_local;
  delta_complex_t *this_local;
  
  orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)thread;
  dim_local = v;
  v_local = cl;
  cl_local = (index_t)this;
  pvVar2 = std::
           vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
           ::operator[](&this->cliques,dim - 1);
  pvVar3 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar2,v_local);
  pvVar4 = std::vector<long,_std::allocator<long>_>::back(&pvVar3->vertices);
  if (*pvVar4 < v) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
    pvVar5 = std::
             vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
             ::operator[](&this->cells,0);
    pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                       (pvVar5,dim_local);
    pvVar2 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](&this->cliques,dim - 1);
    pvVar3 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar2,v_local);
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&pvVar3->vertices,0);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
         ::find(&pvVar6->in_or_out,pvVar4);
    ppVar7 = std::__detail::_Node_iterator<std::pair<const_long,_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_long,_int>,_false,_false> *)&local_58);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_50,&ppVar7->second);
    it.super__Node_iterator_base<std::pair<const_long,_int>,_false>._M_cur._0_4_ = 1;
    while( true ) {
      uVar8 = (ulong)(int)it.super__Node_iterator_base<std::pair<const_long,_int>,_false>._M_cur;
      pvVar2 = std::
               vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ::operator[](&this->cliques,dim - 1);
      pvVar3 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar2,v_local);
      sVar9 = std::vector<long,_std::allocator<long>_>::size(&pvVar3->vertices);
      if (sVar9 <= uVar8) break;
      pvVar5 = std::
               vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ::operator[](&this->cells,0);
      pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                         (pvVar5,dim_local);
      pvVar2 = std::
               vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ::operator[](&this->cliques,dim - 1);
      pvVar3 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar2,v_local);
      pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                         (&pvVar3->vertices,
                          (long)(int)it.super__Node_iterator_base<std::pair<const_long,_int>,_false>
                                     ._M_cur);
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
           ::find(&pvVar6->in_or_out,pvVar4);
      pvVar5 = std::
               vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ::operator[](&this->cells,0);
      pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                         (pvVar5,dim_local);
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
           ::end(&pvVar6->in_or_out);
      bVar1 = std::__detail::operator==(&local_70,&local_78);
      if (bVar1) {
        new_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_ = 1;
        goto LAB_00179784;
      }
      ppVar7 = std::__detail::_Node_iterator<std::pair<const_long,_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_long,_int>,_false,_false> *)&local_70);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_50,&ppVar7->second);
      it.super__Node_iterator_base<std::pair<const_long,_int>,_false>._M_cur._0_4_ =
           (int)it.super__Node_iterator_base<std::pair<const_long,_int>,_false>._M_cur + 1;
    }
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&__range1);
    pvVar2 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](&this->cliques,dim - 1);
    pvVar3 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar2,v_local);
    __end1 = std::vector<long,_std::allocator<long>_>::begin(&pvVar3->vertices);
    j = (long)std::vector<long,_std::allocator<long>_>::end(&pvVar3->vertices);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                       *)&j), bVar1) {
      plVar12 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator*(&__end1);
      cli_loc = *plVar12;
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&__range1,&cli_loc);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end1);
    }
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&__range1,&dim_local);
    pvVar2 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](new_cliques,
                          (size_type)
                          orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    local_c0 = std::vector<clique_t,_std::allocator<clique_t>_>::size(pvVar2);
    pvVar2 = std::
             vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             ::operator[](new_cliques,
                          (size_type)
                          orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    std::vector<long,_std::allocator<long>_>::vector
              (&local_148,(vector<long,_std::allocator<long>_> *)&__range1);
    clique_t::clique_t(&local_130,&local_148,local_c0);
    std::vector<clique_t,_std::allocator<clique_t>_>::push_back(pvVar2,&local_130);
    clique_t::~clique_t(&local_130);
    std::vector<long,_std::allocator<long>_>::~vector(&local_148);
    this_00 = std::
              vector<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
              ::operator[](new_clique_cofaces,
                           (size_type)
                           orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    std::make_tuple<long&,long&,long&>
              ((tuple<long,_long,_long> *)&k,&v_local,&dim_local,(long *)&local_c0);
    std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>::
    push_back(this_00,(value_type *)&k);
    i_1 = 0;
    for (local_168 = 0;
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_50),
        (ulong)(long)local_168 < sVar9; local_168 = local_168 + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_50,(long)local_168);
      if (*pvVar10 == 2) {
        i_1 = i_1 + 1;
      }
    }
    for (top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0; dVar13 = pow(2.0,(double)i_1),
        (double)top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ < dVar13;
        top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage._4_4_ + 1) {
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)((long)&bin.field_2 + 8));
      toBinary_abi_cxx11_((string *)&j_1,
                          top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,i_1);
      local_1ac = 0;
      for (local_1b0 = 0; uVar8 = (ulong)local_1b0,
          sVar9 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_50), uVar8 < sVar9;
          local_1b0 = local_1b0 + 1) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_50,(long)local_1b0);
        if (*pvVar10 == 2) {
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)&j_1);
          if (*pcVar11 == '0') {
            local_1c0[1] = 0;
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)((long)&bin.field_2 + 8),local_1c0 + 1
                      );
          }
          else {
            local_1c0[0] = 1;
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)((long)&bin.field_2 + 8),local_1c0);
          }
          local_1ac = local_1ac + 1;
        }
        else {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_50,(long)local_1b0);
          __range2 = (vector<long,_std::allocator<long>_> *)(long)*pvVar10;
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)((long)&bin.field_2 + 8),
                     (value_type_conflict4 *)&__range2);
        }
      }
      pvVar2 = std::
               vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ::operator[](&this->cliques,dim - 1);
      pvVar3 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar2,v_local);
      __end2 = std::vector<long,_std::allocator<long>_>::begin(&pvVar3->faces);
      f = (long)std::vector<long,_std::allocator<long>_>::end(&pvVar3->faces);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                         *)&f), bVar1) {
        plVar12 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator*(&__end2);
        new_orients.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)&__range3);
        pvVar5 = std::
                 vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ::operator[](&this->cells,dim - 1);
        pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                 operator[](pvVar5,(size_type)
                                   new_orients.
                                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __end3 = std::
                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ::begin(&pvVar6->orientation);
        t.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)std::
                      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                      ::end(&pvVar6->orientation);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                                           *)&t.super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage),
              bVar1) {
          __x = __gnu_cxx::
                __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                ::operator*(&__end3);
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)&loc,__x);
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       *)&__range3,(value_type *)&loc);
          std::vector<long,_std::allocator<long>_>::~vector
                    ((vector<long,_std::allocator<long>_> *)&loc);
          __gnu_cxx::
          __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)&__range3,(value_type *)((long)&bin.field_2 + 8));
        pvVar5 = std::
                 vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ::operator[](new_cells,
                              (size_type)
                              orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
        local_238 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::size
                              (pvVar5);
        pvVar5 = std::
                 vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ::operator[](new_cells,
                              (size_type)
                              orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
        std::vector<long,_std::allocator<long>_>::vector
                  (&local_338,(vector<long,_std::allocator<long>_> *)&__range1);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector(&local_350,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)&__range3);
        delta_complex_cell_t::delta_complex_cell_t
                  (&local_320,&local_338,&local_350,0.0,local_238,local_c0);
        std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::push_back
                  (pvVar5,&local_320);
        delta_complex_cell_t::~delta_complex_cell_t(&local_320);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&local_350);
        std::vector<long,_std::allocator<long>_>::~vector(&local_338);
        pvVar5 = std::
                 vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ::operator[](new_cells,
                              (size_type)
                              orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
        pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::back
                           (pvVar5);
        delta_complex_cell_t::compute_boundary
                  (pvVar6,this,
                   (size_t)orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,new_cell_cofaces);
        pvVar5 = std::
                 vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ::operator[](new_cells,
                              (size_type)
                              orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
        pvVar6 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::back
                           (pvVar5);
        delta_complex_cell_t::assign_filtration(pvVar6,filter,this);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)&__range3);
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  (&__end2);
      }
      std::__cxx11::string::~string((string *)&j_1);
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)((long)&bin.field_2 + 8));
    }
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)&__range1);
    new_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
LAB_00179784:
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  }
  return;
}

Assistant:

void if_common_create(index_t cl, index_t v, index_t dim, const char* filter, size_t thread,
        std::vector<std::vector<delta_complex_cell_t>>& new_cells, std::vector<std::vector<clique_t>>& new_cliques,
        std::vector<std::vector<std::tuple<index_t, index_t, index_t>>>& new_clique_cofaces,std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces ){
		//This checks if the vertex v is a neighbour of all vertices in the clique cliques[dim-1][cl]
		//If it is we create a new clique and then compute all the orientations of the edges and create face for each

		//If v is smaller than the largest vertex in the clique we can ignore it,
		//because such a clique would have been constructed earlier
		//as we construct them by adding larger valued vertices at each step
		if(v <= cliques[dim-1][cl].vertices.back()) return;

		//For each vertex u in the clique check if it is a neighbour of v,
		//if it is the record the orientation of the edge(s) between u and v
		std::vector<int> orient;
		orient.push_back(cells[0][v].in_or_out.find(cliques[dim-1][cl].vertices[0])->second);
		for(int i = 1; i < cliques[dim-1][cl].vertices.size(); i++){
			auto it = cells[0][v].in_or_out.find(cliques[dim-1][cl].vertices[i]);
			if(it == cells[0][v].in_or_out.end()) return;
			orient.push_back(it->second);
		}

		//If we reach this point we know that v is a neighbour of all vertices in the clique
		//so we create a new clique by adding v to the previous vertex set
		//Store the cofaces we need to add to old clique, we do this later as need to know index once parrallel threads have combined
		std::vector<index_t> new_vertices;
		for(auto j : cliques[dim-1][cl].vertices) new_vertices.push_back(j);
		new_vertices.push_back(v);
		index_t cli_loc = new_cliques[thread].size();
		new_cliques[thread].push_back(clique_t(new_vertices,cli_loc));
        new_clique_cofaces[thread].push_back(std::make_tuple(cl,v,cli_loc));

		//compute number of bidirectional edges in new clique
		int num_bidirect = 0;
		for(int k = 0; k < orient.size(); k++){
			if(orient[k] == 2) num_bidirect++;
		}

		//take each number between 0 and the number of bidirection edges and represent it in binary_function
		//we use this to create all orientations of the edges
		for(int i = 0; i < pow(2,num_bidirect); i++){
			//create a new orientation matrix by taking the orientation matrix of the old clique_lookup
			//and add an new bottom row, in this new bottom row we orientate any unidirectional edges
			//in there unique way and then use the binary number to decide how the bidirectional  edges are orientated
			std::vector<index_t> top_row;
			std::string bin = toBinary(i,num_bidirect);
			int count = 0;
			for(int j = 0 ; j < orient.size(); j++){
				if(orient[j] == 2){
					if(bin[count] == '0'){ top_row.push_back(0);
					} else{ top_row.push_back(1); }
					count++;
				} else{
					top_row.push_back(orient[j]);
				}
			}
			//Here we add our new bottom row to each of the orientations of original clique
			for(auto f : cliques[dim-1][cl].faces){
				std::vector<std::vector<index_t>> new_orients;
				for(auto t : cells[dim-1][f].orientation) new_orients.push_back(t);
				new_orients.push_back(top_row);
				//We then create a new face with this orientation matrix
				//add out new face the new clique, and compute the boundary of the new face
				index_t loc = new_cells[thread].size();
				new_cells[thread].push_back(delta_complex_cell_t(new_vertices,new_orients,0,loc,cli_loc));
				new_cells[thread].back().compute_boundary(this,thread,new_cell_cofaces);
				new_cells[thread].back().assign_filtration(filter,this);
			}
		}
    }